

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLin>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  GetterHeatmap<unsigned_short> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  ImVec2 IVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  bool bVar19;
  bool bVar20;
  ImDrawIdx IVar21;
  ImU32 IVar22;
  float fVar23;
  float fVar24;
  ImVec2 IVar25;
  double dVar26;
  ImVec2 IVar27;
  ImVec2 IVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  
  pGVar7 = this->Getter;
  dVar26 = (pGVar7->HalfSize).x;
  dVar32 = (pGVar7->HalfSize).y;
  dVar14 = ((double)(prim / pGVar7->Cols) * pGVar7->Height + dVar32) * pGVar7->YDir + pGVar7->YRef;
  dVar30 = (double)(prim % pGVar7->Cols) * pGVar7->Width + pGVar7->XRef + dVar26;
  fVar23 = (float)(((double)pGVar7->Values[prim] - pGVar7->ScaleMin) /
                  (pGVar7->ScaleMax - pGVar7->ScaleMin));
  fVar29 = 1.0;
  if (fVar23 <= 1.0) {
    fVar29 = fVar23;
  }
  IVar22 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar29));
  pIVar17 = GImPlot;
  pTVar8 = this->Transformer;
  dVar13 = log10((dVar30 - dVar26) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar18 = GImPlot;
  dVar31 = pIVar17->LogDenX;
  pIVar9 = pIVar17->CurrentPlot;
  dVar15 = (pIVar9->XAxis).Range.Min;
  dVar16 = (pIVar9->XAxis).Range.Max;
  iVar5 = pTVar8->YAxis;
  dVar2 = pIVar17->My[iVar5];
  pTVar8 = this->Transformer;
  fVar29 = pIVar17->PixelRange[iVar5].Min.x;
  fVar23 = pIVar17->PixelRange[iVar5].Min.y;
  dVar3 = pIVar9->YAxis[iVar5].Range.Min;
  dVar4 = pIVar17->Mx;
  dVar26 = log10((dVar30 + dVar26) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  if (IVar22 < 0x1000000) {
    bVar20 = false;
  }
  else {
    pIVar9 = pIVar18->CurrentPlot;
    dVar30 = (pIVar9->XAxis).Range.Min;
    iVar5 = pTVar8->YAxis;
    dVar26 = pIVar18->Mx *
             (((double)(float)(dVar26 / pIVar18->LogDenX) * ((pIVar9->XAxis).Range.Max - dVar30) +
              dVar30) - dVar30) + (double)pIVar18->PixelRange[iVar5].Min.x;
    dVar30 = dVar2 * ((dVar14 - dVar32) - dVar3) + (double)fVar23;
    fVar23 = (float)dVar26;
    fVar24 = (float)dVar30;
    dVar31 = dVar4 * (((double)(float)(dVar13 / dVar31) * (dVar16 - dVar15) + dVar15) - dVar15) +
             (double)fVar29;
    dVar32 = pIVar18->My[iVar5] * ((dVar32 + dVar14) - pIVar9->YAxis[iVar5].Range.Min) +
             (double)pIVar18->PixelRange[iVar5].Min.y;
    IVar25.x = (float)dVar31;
    IVar25.y = (float)dVar32;
    fVar29 = fVar24;
    if (IVar25.y <= fVar24) {
      fVar29 = IVar25.y;
    }
    bVar19 = false;
    bVar20 = false;
    if ((fVar29 < (cull_rect->Max).y) &&
       (fVar29 = (float)(~-(uint)(IVar25.y <= fVar24) & (uint)IVar25.y |
                        (uint)fVar24 & -(uint)(IVar25.y <= fVar24)), pfVar1 = &(cull_rect->Min).y,
       bVar20 = bVar19, *pfVar1 <= fVar29 && fVar29 != *pfVar1)) {
      fVar29 = IVar25.x;
      if (fVar23 <= IVar25.x) {
        fVar29 = fVar23;
      }
      if ((fVar29 < (cull_rect->Max).x) &&
         (fVar29 = (float)(~-(uint)(fVar23 <= IVar25.x) & (uint)fVar23 |
                          -(uint)(fVar23 <= IVar25.x) & (uint)IVar25.x),
         (cull_rect->Min).x <= fVar29 && fVar29 != (cull_rect->Min).x)) {
        IVar28.x = (float)dVar31;
        IVar28.y = (float)dVar30;
        IVar27.x = (float)dVar26;
        IVar27.y = (float)dVar32;
        DrawList->_VtxWritePtr->pos = IVar28;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar10 = DrawList->_VtxWritePtr;
        pIVar10->col = IVar22;
        pIVar10[1].pos = IVar25;
        pIVar10[1].uv = *uv;
        pIVar10 = DrawList->_VtxWritePtr;
        pIVar10[1].col = IVar22;
        pIVar10[2].pos = IVar27;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar10 = DrawList->_VtxWritePtr;
        pIVar10[2].col = IVar22;
        IVar12.y = fVar24;
        IVar12.x = fVar23;
        pIVar10[3].pos = IVar12;
        pIVar10[3].uv = *uv;
        pIVar10 = DrawList->_VtxWritePtr;
        pIVar10[3].col = IVar22;
        DrawList->_VtxWritePtr = pIVar10 + 4;
        uVar6 = DrawList->_VtxCurrentIdx;
        pIVar11 = DrawList->_IdxWritePtr;
        IVar21 = (ImDrawIdx)uVar6;
        *pIVar11 = IVar21;
        pIVar11[1] = IVar21 + 1;
        pIVar11[2] = IVar21 + 3;
        pIVar11[3] = IVar21 + 1;
        pIVar11[4] = IVar21 + 2;
        pIVar11[5] = IVar21 + 3;
        DrawList->_IdxWritePtr = pIVar11 + 6;
        DrawList->_VtxCurrentIdx = uVar6 + 4;
        bVar20 = true;
      }
    }
  }
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }